

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

Image * Image::readPNG(path *filename)

{
  int iVar1;
  value_type *__filename;
  __jmp_buf_tag *__env;
  runtime_error *this;
  Image *in_RDI;
  int y;
  int color_type;
  int bit_depth;
  png_uint_32 height;
  png_uint_32 width;
  FILE *file;
  png_infop infoPtr;
  png_structp pngPtr;
  bool success;
  Image *out;
  Image *this_00;
  Size in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  Image *in_stack_ffffffffffffff10;
  long lVar2;
  path *in_stack_ffffffffffffff18;
  Size in_stack_ffffffffffffff20;
  string local_88 [32];
  int local_68;
  undefined4 local_64;
  undefined4 uStack_60;
  undefined1 local_5c [4];
  undefined1 local_58 [4];
  undefined4 local_54;
  undefined4 local_50 [4];
  FILE *local_40;
  long local_38;
  long local_30;
  byte local_21;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 uStack_18;
  undefined1 local_11;
  
  local_11 = 0;
  local_1c = 0;
  uStack_18 = 0;
  local_20 = 0;
  Image(in_stack_ffffffffffffff10,in_stack_ffffffffffffff20,
        SUB84((ulong)in_stack_ffffffffffffff18 >> 0x20,0));
  local_21 = 0;
  local_30 = 0;
  local_38 = 0;
  __filename = std::filesystem::__cxx11::path::c_str((path *)0x10703e);
  local_40 = fopen(__filename,"rb");
  if (((local_40 != (FILE *)0x0) && (local_30 = png_create_read_struct("1.6.37",0,0), local_30 != 0)
      ) && (local_38 = png_create_info_struct(local_30), local_38 != 0)) {
    __env = (__jmp_buf_tag *)png_set_longjmp_fn(local_30,longjmp,200);
    iVar1 = _setjmp(__env);
    if (iVar1 == 0) {
      png_init_io(local_30,local_40);
      png_read_info(local_30,local_38);
      in_stack_fffffffffffffef8 = (char *)0x0;
      in_stack_fffffffffffffef0.width = 0;
      in_stack_fffffffffffffef0.height = 0;
      this_00 = (Image *)0x0;
      png_get_IHDR(local_30,local_38,local_50,&local_54,local_58,local_5c);
      png_set_strip_16(local_30);
      png_set_expand(local_30);
      png_set_gray_to_rgb(local_30);
      png_set_add_alpha(local_30,0xff,1);
      png_read_update_info(local_30,local_38);
      local_64 = local_50[0];
      uStack_60 = local_54;
      fastResize(this_00,in_stack_fffffffffffffef0);
      for (local_68 = 0; local_68 < (in_RDI->size).height; local_68 = local_68 + 1) {
        lVar2 = local_30;
        in_stack_ffffffffffffff18 =
             (path *)pixel((Image *)in_stack_fffffffffffffef0,(int)((ulong)this_00 >> 0x20),
                           (int)this_00);
        png_read_row(lVar2,in_stack_ffffffffffffff18,0);
      }
      local_21 = 1;
    }
  }
  if (local_40 != (FILE *)0x0) {
    fclose(local_40);
  }
  if (local_38 != 0) {
    png_free_data(local_30,local_38,0xffff,0xffffffff);
  }
  if (local_30 != 0) {
    png_destroy_read_struct(&local_30,0);
  }
  if ((local_21 & 1) != 0) {
    return in_RDI;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::filesystem::__cxx11::path::string(in_stack_ffffffffffffff18);
  std::operator+(in_stack_fffffffffffffef8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffef0);
  std::runtime_error::runtime_error(this,local_88);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Image Image::readPNG(const fs::path &filename) {
	Image out;
	bool success = false;
	png_structp pngPtr = NULL;
	png_infop infoPtr = NULL;

	FILE *file = FOPEN(filename.c_str(), "rb");
	if (!file) { goto finalize; }

	pngPtr = png_create_read_struct(PNG_LIBPNG_VER_STRING, NULL, NULL, NULL);
	if (!pngPtr) { goto finalize; }

	infoPtr = png_create_info_struct(pngPtr);
	if (!infoPtr) { goto finalize; }

	if (setjmp(png_jmpbuf(pngPtr))) { goto finalize; }

	png_init_io(pngPtr, file);
	png_read_info(pngPtr, infoPtr);

	png_uint_32 width, height;
	int bit_depth, color_type;
	png_get_IHDR(pngPtr, infoPtr, &width, &height, &bit_depth, &color_type, NULL, NULL, NULL);
	png_set_strip_16(pngPtr);
	png_set_expand(pngPtr);
	png_set_gray_to_rgb(pngPtr);
	png_set_add_alpha(pngPtr, 0xFF, PNG_FILLER_AFTER);
	png_read_update_info(pngPtr, infoPtr);

	out.fastResize({static_cast<int>(width), static_cast<int>(height)});
	for (int y = 0; y < out.size.height; y++) {
		png_read_row(pngPtr, (png_bytep)&out.pixel(0, y), NULL);
	}

	success = true;

finalize:
	if (file) { fclose(file); }
	if (infoPtr) { png_free_data(pngPtr, infoPtr, PNG_FREE_ALL, -1); }
	if (pngPtr) { png_destroy_read_struct(&pngPtr, NULL, NULL); }
	if (success) {
		return out;
	} else {
		throw std::runtime_error("Failed to read PNG from " + filename.string());
	}
}